

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O2

void __thiscall Amiga::Audio::Channel::decrement_length(Channel *this)

{
  uint16_t *puVar1;
  
  if ((this->dma_enabled == true) && (this->wants_data == false)) {
    puVar1 = &this->length_counter;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      this->length_counter = this->length;
      this->will_request_interrupt = true;
      this->should_reload_address = true;
      return;
    }
  }
  return;
}

Assistant:

void Audio::Channel::decrement_length() {
	// if lenfin and AUDxON and AUDxDAT, then lencntrld
	// if (not lenfin) and AUDxON and AUDxDAT, then lencount
	// if lenfin and AUDxON and AUDxDAT, then intreq2
	if(dma_enabled && !wants_data) {
		-- length_counter;

		if(!length_counter) {
			length_counter = length;
			will_request_interrupt = true;
			should_reload_address = true;	// This feels logical to me; it's a bit
											// of a stab in the dark though.
		}
	}
}